

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

vector<example::aln_t,_std::allocator<example::aln_t>_> * __thiscall
rangeless::fn::impl::
sort_by<rangeless::fn::impl::gt<std::_Mem_fn<std::pair<std::__cxx11::string,unsigned_int>example::aln_t::*>>,rangeless::fn::impl::stable_sort_tag>
::operator()(vector<example::aln_t,_std::allocator<example::aln_t>_> *__return_storage_ptr__,
            sort_by<rangeless::fn::impl::gt<std::_Mem_fn<std::pair<std::__cxx11::string,unsigned_int>example::aln_t::*>>,rangeless::fn::impl::stable_sort_tag>
            *this,vector<example::aln_t,_std::allocator<example::aln_t>_> *src)

{
  vector<example::aln_t,_std::allocator<example::aln_t>_> *src_local;
  sort_by<rangeless::fn::impl::gt<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>_>,_rangeless::fn::impl::stable_sort_tag>
  *this_local;
  
  require_iterator_category_at_least<std::random_access_iterator_tag,std::vector<example::aln_t,std::allocator<example::aln_t>>>
            (src);
  operator()(src,this);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::vector(__return_storage_ptr__,src);
  return __return_storage_ptr__;
}

Assistant:

Iterable operator()(Iterable src) const
        {
            impl::require_iterator_category_at_least<std::random_access_iterator_tag>(src);

            // this will fire if Iterable is std::map, where value_type is std::pair<const Key, Value>,
            // which is not move-assignable because of constness.
            static_assert(std::is_move_assignable<typename Iterable::value_type>::value, "value_type must be move-assignable.");

            s_sort( src, 
                    [this](const typename Iterable::value_type& x, 
                           const typename Iterable::value_type& y)
                    {
                        return lt{}(key_fn(x), key_fn(y));
                    }
                    , SortTag{});

            return src;
        }